

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O2

void __thiscall CircularBuffer::Print(CircularBuffer *this,Printer *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  (*p->_vptr_Printer[2])(p,"Circular buffer content:\n<");
  iVar1 = this->index;
  uVar4 = this->outdex;
  iVar3 = 0;
  iVar2 = 0;
  if (this->empty == false) {
    iVar2 = this->capacity;
  }
  if (iVar1 - uVar4 != 0 && (int)uVar4 <= iVar1) {
    iVar2 = 0;
  }
  iVar5 = iVar2 + (iVar1 - uVar4);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  uVar6 = ~uVar4;
  for (; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    (*p->_vptr_Printer[3])(p,(long)this->buffer[(int)uVar4]);
    uVar4 = uVar4 + 1;
    if (this->capacity <= (int)uVar4) {
      uVar4 = 0;
    }
    if (uVar6 + iVar1 + iVar2 != iVar3) {
      (*p->_vptr_Printer[2])(p,", ");
    }
  }
  (*p->_vptr_Printer[2])(p,">\n");
  return;
}

Assistant:

void CircularBuffer::Print(Printer* p)
{
    p->Print("Circular buffer content:\n<");

    int printIndex = outdex;
    int count = index - outdex;

    if (!empty && (index <= outdex))
        count = capacity - (outdex - index);

    for (int i = 0; i < count; i++) {
        p->Print(buffer[printIndex]);
        printIndex = Next(printIndex);
        if (i + 1 != count)
            p->Print(", ");
    }
    p->Print(">\n");
}